

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_request.cc
# Opt level: O0

void __thiscall CSocekt::tmpoutMsgRecvQueue(CSocekt *this)

{
  bool bVar1;
  size_type sVar2;
  CMemory *in_RDI;
  char *sTmpMsgBuf;
  int i;
  int cha;
  CMemory *p_memory;
  int size;
  void *in_stack_ffffffffffffffc8;
  int local_20;
  
  bVar1 = std::__cxx11::list<char_*,_std::allocator<char_*>_>::empty
                    ((list<char_*,_std::allocator<char_*>_> *)(in_RDI + 0x18));
  if (!bVar1) {
    sVar2 = std::__cxx11::list<char_*,_std::allocator<char_*>_>::size
                      ((list<char_*,_std::allocator<char_*>_> *)in_RDI);
    if (999 < (int)sVar2) {
      CMemory::GetInstance();
      for (local_20 = 0; local_20 < (int)sVar2 + -500; local_20 = local_20 + 1) {
        std::__cxx11::list<char_*,_std::allocator<char_*>_>::front
                  ((list<char_*,_std::allocator<char_*>_> *)in_RDI);
        std::__cxx11::list<char_*,_std::allocator<char_*>_>::pop_front
                  ((list<char_*,_std::allocator<char_*>_> *)in_RDI);
        CMemory::FreeMemory(in_RDI,in_stack_ffffffffffffffc8);
      }
    }
  }
  return;
}

Assistant:

void CSocekt::tmpoutMsgRecvQueue()
{
    //日后可能引入outMsgRecvQueue()，这个函数可能需要临界......
    if(m_MsgRecvQueue.empty())  //没有消息直接退出
    {
        return;
    }
    int size = m_MsgRecvQueue.size();
    if(size < 1000) //消息不超过1000条就不处理先
    {
        return;
    }
    //消息达到1000条
    CMemory *p_memory = CMemory::GetInstance();
    int cha = size - 500;
    for(int i = 0; i < cha; ++i)
    {
        //一次干掉一堆
        char *sTmpMsgBuf = m_MsgRecvQueue.front();//返回第一个元素但不检查元素存在与否
        m_MsgRecvQueue.pop_front();               //移除第一个元素但不返回
        p_memory->FreeMemory(sTmpMsgBuf);         //先释放掉把；
    }
    return;
}